

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-pongs.c
# Opt level: O0

void pinger_read_cb(uv_udp_t *udp,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  pinger_t_conflict *pinger_00;
  uint64_t uVar1;
  pinger_t_conflict *pinger;
  ssize_t i;
  uint flags_local;
  sockaddr *addr_local;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_udp_t *udp_local;
  
  pinger_00 = (pinger_t_conflict *)udp->data;
  pinger = (pinger_t_conflict *)0x0;
  do {
    if (nread <= (long)pinger) {
LAB_0010b5d4:
      buf_free(buf);
      return;
    }
    if ((buf->base + -8)[(long)((pinger->udp).handle_queue + -4)] != PING[pinger_00->state]) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-ping-udp.c"
              ,99,"buf->base[i] == PING[pinger->state]");
      abort();
    }
    pinger_00->state = (int)((ulong)(long)(pinger_00->state + 1) % 5);
    if (pinger_00->state == 0) {
      pinger_00->pongs = pinger_00->pongs + 1;
      uVar1 = uv_now(loop);
      if (5000 < uVar1 - start_time) {
        uv_close((uv_handle_t *)udp,pinger_close_cb);
        goto LAB_0010b5d4;
      }
      pinger_write_ping(pinger_00);
    }
    pinger = (pinger_t_conflict *)((long)&pinger->pongs + 1);
  } while( true );
}

Assistant:

static void pinger_read_cb(uv_stream_t* tcp,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  ssize_t i;
  pinger_t* pinger;

  pinger = (pinger_t*)tcp->data;

  if (nread < 0) {
    ASSERT(nread == UV_EOF);

    if (buf->base) {
      buf_free(buf);
    }

    ASSERT(pinger_shutdown_cb_called == 1);
    uv_close((uv_handle_t*)tcp, pinger_close_cb);

    return;
  }

  /* Now we count the pings */
  for (i = 0; i < nread; i++) {
    ASSERT(buf->base[i] == PING[pinger->state]);
    pinger->state = (pinger->state + 1) % (sizeof(PING) - 1);
    if (pinger->state == 0) {
      pinger->pongs++;
      if (uv_now(loop) - start_time > TIME) {
        uv_shutdown(&pinger->shutdown_req,
                    (uv_stream_t*) tcp,
                    pinger_shutdown_cb);
        break;
      } else {
        pinger_write_ping(pinger);
      }
    }
  }

  buf_free(buf);
}